

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

SQInstance * SQInstance::Create(SQSharedState *ss,SQClass *theclass)

{
  long lVar1;
  SQUnsignedInteger SVar2;
  SQInstance *this;
  long local_38;
  SQInstance *newinst;
  SQInteger size;
  SQClass *theclass_local;
  SQSharedState *ss_local;
  
  lVar1 = theclass->_udsize;
  SVar2 = sqvector<SQClassMember>::size(&theclass->_defaultvalues);
  if (SVar2 == 0) {
    local_38 = 0;
  }
  else {
    SVar2 = sqvector<SQClassMember>::size(&theclass->_defaultvalues);
    local_38 = SVar2 - 1;
  }
  SVar2 = lVar1 + local_38 * 0x10 + 0x68;
  this = (SQInstance *)sq_vm_malloc(SVar2);
  SQInstance(this,ss,theclass,SVar2);
  if (theclass->_udsize != 0) {
    this->_userpointer = (SQUserPointer)((long)this + (SVar2 - theclass->_udsize));
  }
  return this;
}

Assistant:

static SQInstance* Create(SQSharedState *ss,SQClass *theclass) {

        SQInteger size = calcinstancesize(theclass);
        SQInstance *newinst = (SQInstance *)SQ_MALLOC(size);
        new (newinst) SQInstance(ss, theclass,size);
        if(theclass->_udsize) {
            newinst->_userpointer = ((unsigned char *)newinst) + (size - theclass->_udsize);
        }
        return newinst;
    }